

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  interval_t *piVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar4 = 0;
      uVar7 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar1[uVar4];
        }
        uVar10 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar10 = count;
        }
        uVar11 = uVar10;
        if (uVar5 != 0) {
          uVar11 = uVar7;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar7 < uVar10) {
              piVar8 = (interval_t *)(pdVar2 + uVar7 * 0x10);
              do {
                BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
                Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                          ((ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>
                            *)state,piVar8,aggr_input_data);
                uVar7 = uVar7 + 1;
                piVar8 = piVar8 + 1;
                uVar11 = uVar7;
              } while (uVar10 != uVar7);
            }
          }
          else if (uVar7 < uVar10) {
            piVar8 = (interval_t *)(pdVar2 + uVar7 * 0x10);
            uVar11 = 0;
            do {
              if ((uVar5 >> (uVar11 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
                Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                          ((ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>
                            *)state,piVar8,aggr_input_data);
              }
              uVar11 = uVar11 + 1;
              piVar8 = piVar8 + 1;
            } while ((uVar7 - uVar10) + uVar11 != 0);
            uVar11 = uVar7 + uVar11;
          }
        }
        uVar4 = uVar4 + 1;
        uVar7 = uVar11;
      } while (uVar4 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
      ConstantOperation<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                ((ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *)state,
                 (interval_t *)input->data,(AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_78.sel)->sel_vector;
        iVar9 = 0;
        do {
          iVar6 = iVar9;
          if (psVar3 != (sel_t *)0x0) {
            iVar6 = (idx_t)psVar3[iVar9];
          }
          BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
          Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                    ((ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *)
                     state,(interval_t *)(local_78.data + iVar6 * 0x10),aggr_input_data);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar3 = (local_78.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar6 = iVar9;
        if (psVar3 != (sel_t *)0x0) {
          iVar6 = (idx_t)psVar3[iVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar6 >> 6]
             >> (iVar6 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
          Execute<duckdb::interval_t,duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>>
                    ((ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *)
                     state,(interval_t *)(local_78.data + iVar6 * 0x10),aggr_input_data);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}